

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * google::protobuf::internal::NameOfDenseEnumSlow_abi_cxx11_(int v,DenseEnumCacheInfo *deci)

{
  bool bVar1;
  EnumDescriptor *desc;
  __pointer_type local_30;
  string **old_cache;
  string **new_cache;
  DenseEnumCacheInfo *deci_local;
  string *psStack_10;
  int v_local;
  
  new_cache = (string **)deci;
  deci_local._4_4_ = v;
  if ((v < deci->min_val) || (deci->max_val < v)) {
    psStack_10 = GetEmptyStringAlreadyInited_abi_cxx11_();
  }
  else {
    desc = (*deci->descriptor_fn)();
    old_cache = MakeDenseEnumCache_abi_cxx11_
                          (desc,*(int *)(new_cache + 1),*(int *)((long)new_cache + 0xc));
    local_30 = (__pointer_type)0x0;
    bVar1 = std::
            atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**>
            ::compare_exchange_strong
                      ((atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**>
                        *)new_cache,&local_30,old_cache,memory_order_release,memory_order_acquire);
    if (bVar1) {
      psStack_10 = old_cache[deci_local._4_4_ - *(int *)(new_cache + 1)];
    }
    else {
      if (old_cache != (string **)0x0) {
        operator_delete__(old_cache);
      }
      psStack_10 = local_30[deci_local._4_4_ - *(int *)(new_cache + 1)];
    }
  }
  return psStack_10;
}

Assistant:

PROTOBUF_NOINLINE const std::string& NameOfDenseEnumSlow(
    int v, DenseEnumCacheInfo* deci) {
  if (v < deci->min_val || v > deci->max_val)
    return GetEmptyStringAlreadyInited();

  const std::string** new_cache =
      MakeDenseEnumCache(deci->descriptor_fn(), deci->min_val, deci->max_val);
  const std::string** old_cache = nullptr;

  if (deci->cache.compare_exchange_strong(old_cache, new_cache,
                                          std::memory_order_release,
                                          std::memory_order_acquire)) {
    // We successfully stored our new cache, and the old value was nullptr.
    return *new_cache[v - deci->min_val];
  } else {
    // In the time it took to create our enum cache, another thread also
    //  created one, and put it into deci->cache.  So delete ours, and
    // use theirs instead.
    delete[] new_cache;
    return *old_cache[v - deci->min_val];
  }
}